

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
CTxMemPool::CheckConflictTopology_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CTxMemPool *this,setEntries *direct_conflicts)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  _Base_ptr p_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  _Rb_tree_header *p_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var7 = (direct_conflicts->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(direct_conflicts->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var8) {
    do {
      plVar3 = *(long **)(p_Var7 + 1);
      uVar4 = plVar3[0x19];
      uVar5 = plVar3[0x1c];
      lVar6 = *plVar3;
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[1];
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        }
      }
      base_blob<256u>::ToString_abi_cxx11_(&local_58,(void *)(lVar6 + 0x39));
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
      }
      if (2 < uVar5) {
        local_98._M_dataplus._M_p = (pointer)(uVar5 - 1);
        tinyformat::format<std::__cxx11::string,unsigned_long>
                  (&local_78,(tinyformat *)"%s has %u ancestors, max 1 allowed",(char *)&local_58,
                   &local_98,(unsigned_long *)in_R8);
LAB_003df769:
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload = puVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p == &local_78.field_2) {
          *puVar1 = CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 0x18) = local_78.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = local_78._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x10) =
               CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                        local_78.field_2._M_local_buf[0]);
        }
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length = local_78._M_string_length;
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = true;
LAB_003df7a4:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        goto LAB_003df7c0;
      }
      if (2 < uVar4) {
        local_98._M_dataplus._M_p = (pointer)(uVar4 - 1);
        tinyformat::format<std::__cxx11::string,unsigned_long>
                  (&local_78,(tinyformat *)"%s has %u descendants, max 1 allowed",(char *)&local_58,
                   &local_98,(unsigned_long *)in_R8);
        goto LAB_003df769;
      }
      in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71((int7)((ulong)in_RCX >> 8),uVar5 < 2 || uVar4 < 2);
      if (uVar5 >= 2 && uVar4 >= 2) {
        tinyformat::format<std::__cxx11::string>
                  (&local_78,
                   (tinyformat *)"%s has both ancestor and descendant, exceeding cluster limit of 2"
                   ,(char *)&local_58,in_RCX);
        goto LAB_003df769;
      }
      if (1 < uVar4) {
        plVar3 = *(long **)(*(long *)(*(long *)(p_Var7 + 1) + 0x58) + 0x20);
        if ((ulong)plVar3[0x1c] < 3) goto LAB_003df6cf;
        lVar6 = *plVar3;
        p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[1];
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          }
        }
        base_blob<256u>::ToString_abi_cxx11_(&local_98,(void *)(lVar6 + 0x39));
        tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                  (&local_78,(tinyformat *)"%s is not the only parent of child %s",(char *)&local_58
                   ,&local_98,in_R8);
LAB_003df88a:
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload = puVar1;
        paVar2 = &local_78.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p == paVar2) {
          *puVar1 = CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 0x18) = local_78.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = local_78._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x10) =
               CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                        local_78.field_2._M_local_buf[0]);
        }
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length = local_78._M_string_length;
        local_78._M_string_length = 0;
        local_78.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = true;
        local_78._M_dataplus._M_p = (pointer)paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
        }
        goto LAB_003df7a4;
      }
      if ((1 < uVar5) &&
         (plVar3 = *(long **)(*(long *)(*(long *)(p_Var7 + 1) + 0x28) + 0x20),
         2 < (ulong)plVar3[0x19])) {
        lVar6 = *plVar3;
        p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[1];
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          }
        }
        base_blob<256u>::ToString_abi_cxx11_(&local_98,(void *)(lVar6 + 0x39));
        tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                  (&local_78,(tinyformat *)"%s is not the only child of parent %s",(char *)&local_58
                   ,&local_98,in_R8);
        goto LAB_003df88a;
      }
LAB_003df6cf:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var8);
  }
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
LAB_003df7c0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> CTxMemPool::CheckConflictTopology(const setEntries& direct_conflicts)
{
    for (const auto& direct_conflict : direct_conflicts) {
        // Ancestor and descendant counts are inclusive of the tx itself.
        const auto ancestor_count{direct_conflict->GetCountWithAncestors()};
        const auto descendant_count{direct_conflict->GetCountWithDescendants()};
        const bool has_ancestor{ancestor_count > 1};
        const bool has_descendant{descendant_count > 1};
        const auto& txid_string{direct_conflict->GetSharedTx()->GetHash().ToString()};
        // The only allowed configurations are:
        // 1 ancestor and 0 descendant
        // 0 ancestor and 1 descendant
        // 0 ancestor and 0 descendant
        if (ancestor_count > 2) {
            return strprintf("%s has %u ancestors, max 1 allowed", txid_string, ancestor_count - 1);
        } else if (descendant_count > 2) {
            return strprintf("%s has %u descendants, max 1 allowed", txid_string, descendant_count - 1);
        } else if (has_ancestor && has_descendant) {
            return strprintf("%s has both ancestor and descendant, exceeding cluster limit of 2", txid_string);
        }
        // Additionally enforce that:
        // If we have a child,  we are its only parent.
        // If we have a parent, we are its only child.
        if (has_descendant) {
            const auto& our_child = direct_conflict->GetMemPoolChildrenConst().begin();
            if (our_child->get().GetCountWithAncestors() > 2) {
                return strprintf("%s is not the only parent of child %s",
                                 txid_string, our_child->get().GetSharedTx()->GetHash().ToString());
            }
        } else if (has_ancestor) {
            const auto& our_parent = direct_conflict->GetMemPoolParentsConst().begin();
            if (our_parent->get().GetCountWithDescendants() > 2) {
                return strprintf("%s is not the only child of parent %s",
                                 txid_string, our_parent->get().GetSharedTx()->GetHash().ToString());
            }
        }
    }
    return std::nullopt;
}